

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

void __thiscall icu_63::TimeZoneFormat::TimeZoneFormat(TimeZoneFormat *this,TimeZoneFormat *other)

{
  int32_t i;
  long lVar1;
  
  Format::Format(&this->super_Format,&other->super_Format);
  (this->super_Format).super_UObject._vptr_UObject = (_func_int **)&PTR__TimeZoneFormat_00398e58;
  Locale::Locale(&this->fLocale);
  this->fTimeZoneNames = (TimeZoneNames *)0x0;
  this->fTimeZoneGenericNames = (TimeZoneGenericNames *)0x0;
  (this->fGMTPattern).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003a7268;
  (this->fGMTPattern).fUnion.fStackFields.fLengthAndFlags = 2;
  lVar1 = 0;
  do {
    *(undefined ***)(this->fTargetRegion + lVar1 + 0x58) = &PTR__UnicodeString_003a7268;
    (this->fTargetRegion + lVar1 + 0x60)[0] = '\x02';
    (this->fTargetRegion + lVar1 + 0x60)[1] = '\0';
    lVar1 = lVar1 + 0x40;
  } while (lVar1 != 0x180);
  (this->fGMTZeroFormat).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003a7268;
  (this->fGMTZeroFormat).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->fGMTPatternPrefix).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003a7268;
  (this->fGMTPatternPrefix).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->fGMTPatternSuffix).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003a7268;
  (this->fGMTPatternSuffix).fUnion.fStackFields.fLengthAndFlags = 2;
  this->fTZDBTimeZoneNames = (TZDBTimeZoneNames *)0x0;
  for (lVar1 = 0; lVar1 != 6; lVar1 = lVar1 + 1) {
    this->fGMTOffsetPatternItems[lVar1] = (UVector *)0x0;
  }
  operator=(this,other);
  return;
}

Assistant:

TimeZoneFormat::TimeZoneFormat(const TimeZoneFormat& other)
: Format(other), fTimeZoneNames(NULL), fTimeZoneGenericNames(NULL),
  fTZDBTimeZoneNames(NULL) {

    for (int32_t i = 0; i < UTZFMT_PAT_COUNT; i++) {
        fGMTOffsetPatternItems[i] = NULL;
    }
    *this = other;
}